

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

void __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
::moveFromOldBuckets
          (DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
           *this,DenseMapPair<llbuild::core::KeyID,_DBKeyID> *OldBucketsBegin,
          DenseMapPair<llbuild::core::KeyID,_DBKeyID> *OldBucketsEnd)

{
  bool bVar1;
  DenseMapPair<llbuild::core::KeyID,_DBKeyID> *in_RAX;
  DenseMapPair<llbuild::core::KeyID,_DBKeyID> *DestBucket;
  DenseMapPair<llbuild::core::KeyID,_DBKeyID> *local_28;
  
  local_28 = in_RAX;
  initEmpty(this);
  do {
    if (OldBucketsBegin == OldBucketsEnd) {
      return;
    }
    if (1 < (OldBucketsBegin->super_pair<llbuild::core::KeyID,_DBKeyID>).first._value + 1) {
      bVar1 = LookupBucketFor<llbuild::core::KeyID>(this,(KeyID *)OldBucketsBegin,&local_28);
      if (bVar1) {
        __assert_fail("!FoundVal && \"Key already in new map?\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                      ,0x176,
                      "void llvm::DenseMapBase<llvm::DenseMap<llbuild::core::KeyID, DBKeyID>, llbuild::core::KeyID, DBKeyID, llvm::DenseMapInfo<llbuild::core::KeyID>, llvm::detail::DenseMapPair<llbuild::core::KeyID, DBKeyID>>::moveFromOldBuckets(BucketT *, BucketT *) [DerivedT = llvm::DenseMap<llbuild::core::KeyID, DBKeyID>, KeyT = llbuild::core::KeyID, ValueT = DBKeyID, KeyInfoT = llvm::DenseMapInfo<llbuild::core::KeyID>, BucketT = llvm::detail::DenseMapPair<llbuild::core::KeyID, DBKeyID>]"
                     );
      }
      (local_28->super_pair<llbuild::core::KeyID,_DBKeyID>).first._value =
           (OldBucketsBegin->super_pair<llbuild::core::KeyID,_DBKeyID>).first._value;
      (local_28->super_pair<llbuild::core::KeyID,_DBKeyID>).second.value =
           (OldBucketsBegin->super_pair<llbuild::core::KeyID,_DBKeyID>).second.value;
      *(int *)(this + 8) = *(int *)(this + 8) + 1;
    }
    OldBucketsBegin = OldBucketsBegin + 1;
  } while( true );
}

Assistant:

void moveFromOldBuckets(BucketT *OldBucketsBegin, BucketT *OldBucketsEnd) {
    initEmpty();

    // Insert all the old elements.
    const KeyT EmptyKey = getEmptyKey();
    const KeyT TombstoneKey = getTombstoneKey();
    for (BucketT *B = OldBucketsBegin, *E = OldBucketsEnd; B != E; ++B) {
      if (!KeyInfoT::isEqual(B->getFirst(), EmptyKey) &&
          !KeyInfoT::isEqual(B->getFirst(), TombstoneKey)) {
        // Insert the key/value into the new table.
        BucketT *DestBucket;
        bool FoundVal = LookupBucketFor(B->getFirst(), DestBucket);
        (void)FoundVal; // silence warning.
        assert(!FoundVal && "Key already in new map?");
        DestBucket->getFirst() = std::move(B->getFirst());
        ::new (&DestBucket->getSecond()) ValueT(std::move(B->getSecond()));
        incrementNumEntries();

        // Free the value.
        B->getSecond().~ValueT();
      }
      B->getFirst().~KeyT();
    }
  }